

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void TrackGlobalIntAssignments(ParseNodePtr pnode,ByteCodeGenerator *byteCodeGenerator)

{
  OpCode OVar1;
  ParseNode *this;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ParseNodeUni *pPVar5;
  undefined4 *puVar6;
  ParseNodeName *pPVar7;
  ParseNodeBin *pPVar8;
  ParseNodePtr this_00;
  
  uVar4 = ParseNode::Grfnop((uint)pnode->nop);
  if ((uVar4 & 0x20) == 0) {
    return;
  }
  if ((uVar4 & 8) == 0) {
    if ((uVar4 & 4) == 0) {
      return;
    }
    pPVar5 = ParseNode::AsParseNodeUni(pnode);
    this_00 = pPVar5->pnode1;
  }
  else {
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    this_00 = pPVar8->pnode1;
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    this = pPVar8->pnode2;
    if (this_00 == (ParseNodePtr)0x0 || this == (ParseNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x2b4b,"(lhs && rhs)","lhs && rhs");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    OVar1 = this->nop;
    if (OVar1 - 0x3a < 2) {
      pPVar8 = ParseNode::AsParseNodeBin(this);
      if (pPVar8->pnode1->nop != knopInt) {
        return;
      }
      pPVar8 = ParseNode::AsParseNodeBin(this);
      if (pPVar8->pnode2->nop != knopInt) {
        return;
      }
    }
    else if (OVar1 != knopInt) {
      if (OVar1 != knopObject) {
        return;
      }
      TrackMemberNodesInObjectForIntConstants(byteCodeGenerator,this);
    }
  }
  if (this_00->nop == knopDot) {
    pPVar8 = ParseNode::AsParseNodeBin(this_00);
    if (pPVar8->pnode2->nop == knopName) {
      TrackGlobalIntAssignmentsForknopDotProps(this_00,byteCodeGenerator);
      return;
    }
  }
  else if (this_00->nop == knopName) {
    pPVar7 = ParseNode::AsParseNodeName(this_00);
    TrackIntConstantsOnGlobalObject(byteCodeGenerator,pPVar7->sym);
    return;
  }
  return;
}

Assistant:

void TrackGlobalIntAssignments(ParseNodePtr pnode, ByteCodeGenerator * byteCodeGenerator)
{
    // Track the Global Int Constant properties' assignments here.
    uint nodeType = ParseNode::Grfnop(pnode->nop);
    if (nodeType & fnopAsg)
    {
        if (nodeType & fnopBin)
        {
            ParseNodePtr lhs = pnode->AsParseNodeBin()->pnode1;
            ParseNodePtr rhs = pnode->AsParseNodeBin()->pnode2;

            Assert(lhs && rhs);

            // Don't track other than integers and objects with member nodes.
            if (rhs->nop == knopObject)
            {
                TrackMemberNodesInObjectForIntConstants(byteCodeGenerator, rhs);
            }
            else if (rhs->nop != knopInt &&
                ((rhs->nop != knopLsh && rhs->nop != knopRsh) || (rhs->AsParseNodeBin()->pnode1->nop != knopInt || rhs->AsParseNodeBin()->pnode2->nop != knopInt)))
            {
                return;
            }

            if (lhs->nop == knopName)
            {
                // Handle "a = <Integer>" cases here
                Symbol * sym = lhs->AsParseNodeName()->sym;
                TrackIntConstantsOnGlobalObject(byteCodeGenerator, sym);
            }
            else if (lhs->nop == knopDot && lhs->AsParseNodeBin()->pnode2->nop == knopName)
            {
                // Cases like "obj.a = <Integer>"
                TrackGlobalIntAssignmentsForknopDotProps(lhs, byteCodeGenerator);
            }
        }
        else if (nodeType & fnopUni)
        {
            ParseNodePtr lhs = pnode->AsParseNodeUni()->pnode1;

            if (lhs->nop == knopName)
            {
                // Cases like "a++"
                Symbol * sym = lhs->AsParseNodeName()->sym;
                TrackIntConstantsOnGlobalObject(byteCodeGenerator, sym);
            }
            else if (lhs->nop == knopDot && lhs->AsParseNodeBin()->pnode2->nop == knopName)
            {
                // Cases like "obj.a++"
                TrackGlobalIntAssignmentsForknopDotProps(lhs, byteCodeGenerator);
            }
        }
    }
}